

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

sx_coro_context * sx_coro_create_context(sx_alloc *alloc,int num_initial_fibers,int stack_sz)

{
  code *pcVar1;
  sx_coro_context *psVar2;
  size_t sVar3;
  sx_pool *psVar4;
  sx_coro_context *ctx;
  int stack_sz_local;
  int num_initial_fibers_local;
  sx_alloc *alloc_local;
  
  if (num_initial_fibers < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xaa,"num_initial_fibers > 0");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx_coro_context *)(*pcVar1)();
    return psVar2;
  }
  sVar3 = sx_os_minstacksz();
  if ((ulong)(long)stack_sz < sVar3) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xab,"stack size too small");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx_coro_context *)(*pcVar1)();
    return psVar2;
  }
  psVar2 = (sx_coro_context *)sx__malloc(alloc,0x30,0,(char *)0x0,(char *)0x0,0);
  if (psVar2 == (sx_coro_context *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0xaf);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xaf,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx_coro_context *)(*pcVar1)();
    return psVar2;
  }
  memset(psVar2,0,0x30);
  psVar2->alloc = alloc;
  psVar4 = sx__pool_create(alloc,0x50,num_initial_fibers,
                           "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c"
                           ,"sx_coro_context *sx_coro_create_context(const sx_alloc *, int, int)",
                           0xb6);
  psVar2->coro_pool = psVar4;
  if (psVar2->coro_pool == (sx_pool *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0xb8);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xb8,"Out of memory");
    pcVar1 = (code *)swi(3);
    psVar2 = (sx_coro_context *)(*pcVar1)();
    return psVar2;
  }
  psVar2->stack_sz = stack_sz;
  return psVar2;
}

Assistant:

sx_coro_context* sx_coro_create_context(const sx_alloc* alloc, int num_initial_fibers, int stack_sz)
{
    sx_assert(num_initial_fibers > 0);
    sx_assertf((size_t)stack_sz >= sx_os_minstacksz(), "stack size too small");

    sx_coro_context* ctx = (sx_coro_context*)sx_malloc(alloc, sizeof(sx_coro_context));
    if (!ctx) {
        sx_out_of_memory();
        return NULL;
    }
    sx_memset(ctx, 0x0, sizeof(sx_coro_context));

    ctx->alloc = alloc;

    ctx->coro_pool = sx_pool_create(alloc, sizeof(sx__coro_state), num_initial_fibers);
    if (!ctx->coro_pool) {
        sx_out_of_memory();
        return NULL;
    }
    ctx->stack_sz = stack_sz;

    return ctx;
}